

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall spirv_cross::CompilerGLSL::emit_pls(CompilerGLSL *this)

{
  bool bVar1;
  CompilerError *pCVar2;
  undefined1 local_120 [40];
  PlsRemap *output;
  iterator __end2_1;
  iterator __begin2_1;
  vector<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_> *__range2_1;
  reference local_c0;
  PlsRemap *input;
  iterator __end2;
  iterator __begin2;
  vector<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_> *__range2;
  string local_98 [38];
  char local_72;
  allocator local_71;
  string local_70 [35];
  char local_4d;
  allocator local_39;
  string local_38 [32];
  SPIREntryPoint *local_18;
  SPIREntryPoint *execution;
  CompilerGLSL *this_local;
  
  execution = (SPIREntryPoint *)this;
  local_18 = Compiler::get_entry_point(&this->super_Compiler);
  if (local_18->model != ExecutionModelFragment) {
    local_4d = '\x01';
    pCVar2 = (CompilerError *)__cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_38,"Pixel local storage only supported in fragment shaders.",&local_39);
    CompilerError::CompilerError(pCVar2,(string *)local_38);
    local_4d = '\0';
    __cxa_throw(pCVar2,&CompilerError::typeinfo,CompilerError::~CompilerError);
  }
  if (((this->options).es & 1U) == 0) {
    local_72 = '\x01';
    pCVar2 = (CompilerError *)__cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_70,"Pixel local storage only supported in OpenGL ES.",&local_71);
    CompilerError::CompilerError(pCVar2,(string *)local_70);
    local_72 = '\0';
    __cxa_throw(pCVar2,&CompilerError::typeinfo,CompilerError::~CompilerError);
  }
  if ((this->options).version < 300) {
    __range2._6_1_ = 1;
    pCVar2 = (CompilerError *)__cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_98,"Pixel local storage only supported in ESSL 3.0 and above.",
               (allocator *)((long)&__range2 + 7));
    CompilerError::CompilerError(pCVar2,(string *)local_98);
    __range2._6_1_ = 0;
    __cxa_throw(pCVar2,&CompilerError::typeinfo,CompilerError::~CompilerError);
  }
  bVar1 = ::std::vector<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>::empty
                    (&this->pls_inputs);
  if (!bVar1) {
    statement<char_const(&)[27]>(this,(char (*) [27])"__pixel_local_inEXT _PLSIn");
    begin_scope(this);
    __end2 = ::std::vector<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>::begin
                       (&this->pls_inputs);
    input = (PlsRemap *)
            ::std::vector<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>::end
                      (&this->pls_inputs);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<spirv_cross::PlsRemap_*,_std::vector<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>_>
                                  *)&input);
      if (!bVar1) break;
      local_c0 = __gnu_cxx::
                 __normal_iterator<spirv_cross::PlsRemap_*,_std::vector<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>_>
                 ::operator*(&__end2);
      pls_decl_abi_cxx11_((CompilerGLSL *)&__range2_1,(PlsRemap *)this);
      statement<std::__cxx11::string,char_const(&)[2]>
                (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &__range2_1,(char (*) [2])0x4d9ce2);
      ::std::__cxx11::string::~string((string *)&__range2_1);
      __gnu_cxx::
      __normal_iterator<spirv_cross::PlsRemap_*,_std::vector<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>_>
      ::operator++(&__end2);
    }
    end_scope_decl(this);
    statement<char_const(&)[1]>(this,(char (*) [1])0x4d8596);
  }
  bVar1 = ::std::vector<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>::empty
                    (&this->pls_outputs);
  if (!bVar1) {
    statement<char_const(&)[29]>(this,(char (*) [29])"__pixel_local_outEXT _PLSOut");
    begin_scope(this);
    __end2_1 = ::std::vector<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>::begin
                         (&this->pls_outputs);
    output = (PlsRemap *)
             ::std::vector<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>::end
                       (&this->pls_outputs);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2_1,
                         (__normal_iterator<spirv_cross::PlsRemap_*,_std::vector<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>_>
                          *)&output);
      if (!bVar1) break;
      local_120._32_8_ =
           __gnu_cxx::
           __normal_iterator<spirv_cross::PlsRemap_*,_std::vector<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>_>
           ::operator*(&__end2_1);
      pls_decl_abi_cxx11_((CompilerGLSL *)local_120,(PlsRemap *)this);
      statement<std::__cxx11::string,char_const(&)[2]>
                (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120
                 ,(char (*) [2])0x4d9ce2);
      ::std::__cxx11::string::~string((string *)local_120);
      __gnu_cxx::
      __normal_iterator<spirv_cross::PlsRemap_*,_std::vector<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>_>
      ::operator++(&__end2_1);
    }
    end_scope_decl(this);
    statement<char_const(&)[1]>(this,(char (*) [1])0x4d8596);
  }
  return;
}

Assistant:

void CompilerGLSL::emit_pls()
{
	auto &execution = get_entry_point();
	if (execution.model != ExecutionModelFragment)
		SPIRV_CROSS_THROW("Pixel local storage only supported in fragment shaders.");

	if (!options.es)
		SPIRV_CROSS_THROW("Pixel local storage only supported in OpenGL ES.");

	if (options.version < 300)
		SPIRV_CROSS_THROW("Pixel local storage only supported in ESSL 3.0 and above.");

	if (!pls_inputs.empty())
	{
		statement("__pixel_local_inEXT _PLSIn");
		begin_scope();
		for (auto &input : pls_inputs)
			statement(pls_decl(input), ";");
		end_scope_decl();
		statement("");
	}

	if (!pls_outputs.empty())
	{
		statement("__pixel_local_outEXT _PLSOut");
		begin_scope();
		for (auto &output : pls_outputs)
			statement(pls_decl(output), ";");
		end_scope_decl();
		statement("");
	}
}